

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_snap_prep(ASMState *as)

{
  int iVar1;
  ASMState *as_00;
  long in_RDI;
  IRIns *ir;
  IRRef in_stack_ffffffffffffffec;
  
  if (*(int *)(in_RDI + 0xf8) == 0) {
    while (*(uint *)(in_RDI + 0xd8) < *(uint *)(*(long *)(in_RDI + 0x110) + 8)) {
      as_00 = (ASMState *)
              (*(long *)(*(long *)(in_RDI + 0x110) + 0x10) + (ulong)*(uint *)(in_RDI + 0xd8) * 8);
      iVar1 = asm_snap_checkrename(as_00,in_stack_ffffffffffffffec);
      if (iVar1 != 0) {
        *(undefined2 *)((long)as_00->cost + 2) = 0x7fff;
      }
      *(int *)(in_RDI + 0xd8) = *(int *)(in_RDI + 0xd8) + 1;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0xf8) = 0;
    asm_snap_alloc(as,ir._4_4_);
    *(undefined4 *)(in_RDI + 0xd8) = *(undefined4 *)(*(long *)(in_RDI + 0x110) + 8);
  }
  return;
}

Assistant:

static void asm_snap_prep(ASMState *as)
{
  if (as->snapalloc) {
    /* Alloc on first invocation for each snapshot. */
    as->snapalloc = 0;
    asm_snap_alloc(as, as->snapno);
    as->snaprename = as->T->nins;
  } else {
    /* Check any renames above the highwater mark. */
    for (; as->snaprename < as->T->nins; as->snaprename++) {
      IRIns *ir = &as->T->ir[as->snaprename];
      if (asm_snap_checkrename(as, ir->op1))
	ir->op2 = REF_BIAS-1;  /* Kill rename. */
    }
  }
}